

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O2

int new_value(json_state *state,json_value **top,json_value **root,json_value **alloc,json_type type
             )

{
  json_type jVar1;
  json_value *pjVar2;
  int iVar3;
  _json_value *p_Var4;
  char *pcVar5;
  ulong uVar6;
  unsigned_long size;
  
  if (state->first_pass != 0) {
    p_Var4 = (_json_value *)json_alloc(state,(state->settings).value_extra + 0x28,1);
    if (p_Var4 == (_json_value *)0x0) {
      return 0;
    }
    if (*root == (json_value *)0x0) {
      *root = p_Var4;
    }
    p_Var4->type = type;
    p_Var4->parent = *top;
    if (*alloc != (json_value *)0x0) {
      ((*alloc)->_reserved).next_alloc = p_Var4;
    }
    *top = p_Var4;
    *alloc = p_Var4;
    return 1;
  }
  pjVar2 = *alloc;
  *top = pjVar2;
  *alloc = (json_value *)pjVar2->_reserved;
  if (*root == (json_value *)0x0) {
    *root = pjVar2;
  }
  jVar1 = pjVar2->type;
  if (jVar1 == json_object) {
    if ((pjVar2->u).boolean == 0) {
      return 1;
    }
    iVar3 = (pjVar2->u).boolean * 0x18;
    pcVar5 = (char *)json_alloc(state,(unsigned_long)((pjVar2->u).string.ptr + iVar3),0);
    (pjVar2->u).string.ptr = pcVar5;
    if (pcVar5 == (char *)0x0) {
      return 0;
    }
    (pjVar2->_reserved).next_alloc = (_json_value *)(pcVar5 + iVar3);
  }
  else {
    if (jVar1 == json_string) {
      size = (unsigned_long)((pjVar2->u).boolean + 1);
    }
    else {
      if (jVar1 != json_array) {
        return 1;
      }
      uVar6 = (ulong)(pjVar2->u).string.length;
      if (uVar6 == 0) {
        return 1;
      }
      size = uVar6 << 3;
    }
    pcVar5 = (char *)json_alloc(state,size,0);
    (pjVar2->u).string.ptr = pcVar5;
    if (pcVar5 == (char *)0x0) {
      return 0;
    }
  }
  (pjVar2->u).boolean = 0;
  return 1;
}

Assistant:

static int new_value (json_state * state,
                      json_value ** top, json_value ** root, json_value ** alloc,
                      json_type type)
{
   json_value * value;
   int values_size;

   if (!state->first_pass)
   {
      value = *top = *alloc;
      *alloc = (*alloc)->_reserved.next_alloc;

      if (!*root)
         *root = value;

      switch (value->type)
      {
         case json_array:

            if (value->u.array.length == 0)
               break;

            if (! (value->u.array.values = (json_value **) json_alloc
               (state, value->u.array.length * sizeof (json_value *), 0)) )
            {
               return 0;
            }

            value->u.array.length = 0;
            break;

         case json_object:

            if (value->u.object.length == 0)
               break;

            values_size = sizeof (*value->u.object.values) * value->u.object.length;

            if (! (value->u.object.values = (json_object_entry *) json_alloc
                  (state, values_size + ((unsigned long) value->u.object.values), 0)) )
            {
               return 0;
            }

            value->_reserved.object_mem = (*(char **) &value->u.object.values) + values_size;

            value->u.object.length = 0;
            break;

         case json_string:

            if (! (value->u.string.ptr = (json_char *) json_alloc
               (state, (value->u.string.length + 1) * sizeof (json_char), 0)) )
            {
               return 0;
            }

            value->u.string.length = 0;
            break;

         default:
            break;
      };

      return 1;
   }

   if (! (value = (json_value *) json_alloc
         (state, sizeof (json_value) + state->settings.value_extra, 1)))
   {
      return 0;
   }

   if (!*root)
      *root = value;

   value->type = type;
   value->parent = *top;

   #ifdef JSON_TRACK_SOURCE
      value->line = state->cur_line;
      value->col = state->cur_col;
   #endif

   if (*alloc)
      (*alloc)->_reserved.next_alloc = value;

   *alloc = *top = value;

   return 1;
}